

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lut.c
# Opt level: O1

_Bool chck_lut_set(chck_lut *lut,uint32_t lookup,void *data)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint32_t uVar5;
  size_t sVar6;
  uint8_t *__s;
  
  if ((lut == (chck_lut *)0x0) || (lut->hashuint == (_func_uint32_t_uint32_t *)0x0)) {
    __assert_fail("lut && lut->hashuint",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c",
                  0x6d,"_Bool chck_lut_set(struct chck_lut *, uint32_t, const void *)");
  }
  uVar5 = (*lut->hashuint)(lookup);
  uVar1 = lut->count;
  if (lut->table == (uint8_t *)0x0) {
    uVar2 = lut->member;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar2;
    sVar6 = SUB168(auVar3 * auVar4,0);
    if (sVar6 == 0 || SUB168(auVar3 * auVar4,8) != 0) {
      __s = (uint8_t *)0x0;
    }
    else {
      __s = (uint8_t *)malloc(sVar6);
    }
    lut->table = __s;
    if (__s == (uint8_t *)0x0) {
      return false;
    }
    memset(__s,lut->set,uVar2 * uVar1);
  }
  sVar6 = lut->member;
  if (data == (void *)0x0) {
    memset(lut->table + ((ulong)uVar5 % uVar1) * sVar6,lut->set,sVar6);
  }
  else {
    memcpy(lut->table + ((ulong)uVar5 % uVar1) * sVar6,data,sVar6);
  }
  return true;
}

Assistant:

bool
chck_lut_set(struct chck_lut *lut, uint32_t lookup, const void *data)
{
   assert(lut && lut->hashuint);
   return lut_set_index(lut, lut->hashuint(lookup) % lut->count, data);
}